

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

RequiredError *
CLI::RequiredError::Option(size_t min_option,size_t max_option,size_t used,string *option_list)

{
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  ExitCodes in_stack_fffffffffffffca4;
  string *in_stack_fffffffffffffca8;
  RequiredError *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [17];
  
  if (((in_RSI == 1) && (in_RDX == 1)) && (in_RCX == 0)) {
    ::std::operator+(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    ::std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
    RequiredError((RequiredError *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
  }
  else if (((in_RSI == 1) && (in_RDX == 1)) && (1 < in_RCX)) {
    ::std::operator+(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    ::std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc68);
    ::std::operator+(in_stack_fffffffffffffc68,in_RDI);
    ::std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
    RequiredError(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
  }
  else if ((in_RSI == 1) && (in_RCX == 0)) {
    ::std::operator+(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    ::std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
    RequiredError((RequiredError *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
  }
  else if (in_RCX < in_RSI) {
    pbVar1 = local_238;
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc68);
    ::std::operator+((char *)pbVar1,in_stack_fffffffffffffc30);
    ::std::operator+(pbVar1,(char *)in_stack_fffffffffffffc30);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc68);
    ::std::operator+(in_stack_fffffffffffffc68,in_RDI);
    ::std::operator+(pbVar1,(char *)in_stack_fffffffffffffc30);
    ::std::operator+(pbVar1,in_stack_fffffffffffffc30);
    ::std::operator+(pbVar1,(char *)in_stack_fffffffffffffc30);
    RequiredError(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
  }
  else if (in_RDX == 1) {
    pbVar1 = local_298;
    ::std::operator+(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    ::std::operator+(in_stack_fffffffffffffc38,(char *)pbVar1);
    RequiredError(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4);
    ::std::__cxx11::string::~string(pbVar1);
    ::std::__cxx11::string::~string(pbVar1);
  }
  else {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc68);
    ::std::operator+((char *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    ::std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc68);
    ::std::operator+(in_stack_fffffffffffffc68,in_RDI);
    ::std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
    ::std::operator+(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    ::std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
    RequiredError(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffc30);
  }
  return (RequiredError *)in_RDI;
}

Assistant:

static RequiredError
    Option(std::size_t min_option, std::size_t max_option, std::size_t used, const std::string &option_list) {
        if((min_option == 1) && (max_option == 1) && (used == 0))
            return RequiredError("Exactly 1 option from [" + option_list + "]");
        if((min_option == 1) && (max_option == 1) && (used > 1)) {
            return {"Exactly 1 option from [" + option_list + "] is required but " + std::to_string(used) +
                        " were given",
                    ExitCodes::RequiredError};
        }
        if((min_option == 1) && (used == 0))
            return RequiredError("At least 1 option from [" + option_list + "]");
        if(used < min_option) {
            return {"Requires at least " + std::to_string(min_option) + " options used but only " +
                        std::to_string(used) + " were given from [" + option_list + "]",
                    ExitCodes::RequiredError};
        }
        if(max_option == 1)
            return {"Requires at most 1 options be given from [" + option_list + "]", ExitCodes::RequiredError};

        return {"Requires at most " + std::to_string(max_option) + " options be used but " + std::to_string(used) +
                    " were given from [" + option_list + "]",
                ExitCodes::RequiredError};
    }